

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.h
# Opt level: O2

void __thiscall
FxConstant::FxConstant(FxConstant *this,PType *type,VMValue *vmval,FScriptPosition *pos)

{
  VM_UBYTE VVar1;
  ExpVal EStack_28;
  
  FxExpression::FxExpression(&this->super_FxExpression,EFX_Constant,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_00707480;
  (this->value).field_1.Int = 0;
  (this->value).Type = type;
  (this->super_FxExpression).ValueType = type;
  (this->super_FxExpression).isresolved = true;
  VVar1 = (vmval->field_0).field_3.Type;
  if (VVar1 == '\x01') {
    (this->value).field_1 = (anon_union_8_3_addc324a_for_ExpVal_1)(vmval->field_0).field_1.a;
  }
  else if (VVar1 == '\x02') {
    ExpVal::ExpVal(&EStack_28,(FString *)vmval);
    ExpVal::operator=(&this->value,&EStack_28);
    ExpVal::~ExpVal(&EStack_28);
  }
  else if (VVar1 == '\x03') {
    (this->value).field_1 = (anon_union_8_3_addc324a_for_ExpVal_1)(vmval->field_0).field_1.a;
  }
  else {
    (this->value).field_1.Int = (vmval->field_0).i;
  }
  return;
}

Assistant:

FxConstant(PType *type, VMValue &vmval, const FScriptPosition &pos) : FxExpression(EFX_Constant, pos)
	{
		ValueType = value.Type = type;
		isresolved = true;
		switch (vmval.Type)
		{
		default:
		case REGT_INT:
			value.Int = vmval.i;
			break;

		case REGT_FLOAT:
			value.Float = vmval.f;
			break;

		case REGT_STRING:
			value = ExpVal(vmval.s());
			break;

		case REGT_POINTER:
			value.pointer = vmval.a;
			break;
		}
	}